

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  ShaderType SVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *pRVar5;
  SharedPtrStateBase *pSVar6;
  Node *pNVar7;
  deInt32 *pdVar8;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr layout;
  SharedPtr variable_3;
  undefined1 local_a0 [8];
  SharedPtrStateBase *pSStack_98;
  MatrixOrder local_90;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  TestNode *local_58;
  Context *local_50;
  Node *local_48;
  SharedPtrStateBase *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar3 = parentStructure->m_ptr;
  NVar1 = pNVar3->m_type;
  local_58 = &targetGroup->super_TestNode;
  local_50 = context;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pNVar7 = (Node *)operator_new(0x28);
    pSVar6 = parentStructure->m_state;
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 1;
    local_48 = pNVar7;
    local_40 = (SharedPtrStateBase *)operator_new(0x20);
    local_40->strongRefCount = 0;
    local_40->weakRefCount = 0;
    local_40->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_40[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    local_40->strongRefCount = 1;
    local_40->weakRefCount = 1;
  }
  else {
    local_40 = parentStructure->m_state;
    local_48 = pNVar3;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_40->weakRefCount = local_40->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskLastStage(presentShadersMask);
  if (((NVar1 == TYPE_DEFAULT_BLOCK) && (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar2 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar2 != SHADERTYPE_TESSELLATION_CONTROL) {
      if (SVar2 != SHADERTYPE_FRAGMENT) goto LAB_01579e4a;
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_VARIABLE;
      (pNVar3->m_enclosingNode).m_ptr = local_48;
      (pNVar3->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
      local_a0 = (undefined1  [8])pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_98 = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_78,
                 "var");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
      pSVar6 = pSStack_98;
      pdVar8 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
      pNVar3 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar3->m_enclosingNode).m_ptr = local_48;
      (pNVar3->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
      pNVar3[1]._vptr_Node = (_func_int **)local_a0;
      *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
      *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar3;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_VARIABLE;
      (pNVar7->m_enclosingNode).m_ptr = pNVar3;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
      pSStack_98 = (SharedPtrStateBase *)0x0;
      local_a0 = (undefined1  [8])pNVar7;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_98 = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_88,
                 "var_explicit_location");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
      pSVar6 = pSStack_98;
      pdVar8 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
      pSVar6 = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar8 = &(local_78.m_state)->strongRefCount;
        *pdVar8 = *pdVar8 + -1;
        UNLOCK();
        if (*pdVar8 == 0) {
          local_78.m_ptr = (Node *)0x0;
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
        }
        LOCK();
        pdVar8 = &pSVar6->weakRefCount;
        *pdVar8 = *pdVar8 + -1;
        UNLOCK();
        if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar3->m_enclosingNode).m_ptr = local_48;
      (pNVar3->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
      pSStack_98 = (SharedPtrStateBase *)0x0;
      local_a0 = (undefined1  [8])pNVar3;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_98 = pSVar6;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_VARIABLE;
      (pNVar7->m_enclosingNode).m_ptr = pNVar3;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar7;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_78.m_state = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_50,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_array");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
      pSVar6 = local_78.m_state;
      pdVar8 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      pSVar6 = pSStack_98;
      if (pSStack_98 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar8 = &pSStack_98->strongRefCount;
        *pdVar8 = *pdVar8 + -1;
        UNLOCK();
        if (*pdVar8 == 0) {
          local_a0 = (undefined1  [8])0x0;
          (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
        }
        LOCK();
        pdVar8 = &pSVar6->weakRefCount;
        *pdVar8 = *pdVar8 + -1;
        UNLOCK();
        if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
          (*pSStack_98->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar3 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a0,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar3->m_enclosingNode).m_ptr = local_48;
      (pNVar3->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
      pNVar3[1]._vptr_Node = (_func_int **)local_a0;
      *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
      *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar3;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar7->m_enclosingNode).m_ptr = pNVar3;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 0xffffffff;
      pSStack_98 = (SharedPtrStateBase *)0x0;
      local_a0 = (undefined1  [8])pNVar7;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_98 = pSVar6;
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_VARIABLE;
      (pNVar3->m_enclosingNode).m_ptr = pNVar7;
      (pNVar3->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar3;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_88.m_state = pSVar6;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
                 "var_array_explicit_location");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
      goto LAB_01578ca5;
    }
    pNVar7 = (Node *)operator_new(0x28);
    pNVar3 = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 6;
    local_78.m_ptr = pNVar7;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_88.m_ptr = pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,"var");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_88.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 0xfffffffe;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar7;
    (pNVar3->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_68.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase(pRVar5,local_50,&local_68,&local_38,"var_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_68.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_98 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_88,
               "patch_var");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = pSStack_98;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_98 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = pSStack_98;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_struct");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_88.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x20);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_STRUCT_MEMBER;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar7;
    (pNVar3->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_68.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_68,&local_38,"patch_var_struct_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_68.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_array");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_88.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar7;
    (pNVar3->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_68.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_68,&local_38,"patch_var_array_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_68.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      pSVar6 = local_88.m_state;
      if (*pdVar8 != 0) goto LAB_01579e0d;
LAB_01578d16:
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        (*pSVar6->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  else {
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_98 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_78,
               "var");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = pSStack_98;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_98 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_88,
               "var_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = pSStack_98;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_78.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_struct");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_78.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x20);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_STRUCT_MEMBER;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar7;
    (pNVar3->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_struct_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_88.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_78.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar7;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_array");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
    pSVar6 = local_78.m_state;
    pdVar8 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_48;
    (pNVar3->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
    pNVar3[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_90;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar7->m_enclosingNode).m_ptr = pNVar3;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar7;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar7;
    (pNVar3->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_array_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
LAB_01578ca5:
    pSVar4 = local_88.m_state;
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar8 = &pSVar4->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_98->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      pSVar6 = pSStack_98;
      if (*pdVar8 == 0) goto LAB_01578d16;
    }
  }
LAB_01579e0d:
  pSVar6 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &(local_78.m_state)->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
LAB_01579e4a:
  pSVar6 = local_40;
  if (local_40 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &local_40->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_48 = (Node *)0x0;
      (*local_40->_vptr_SharedPtrStateBase[2])(local_40);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_40 != (SharedPtrStateBase *)0x0)) {
      (*local_40->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramOutputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																	: (parentStructure);
	const glu::ShaderType						lastStage		= getShaderMaskLastStage(presentShadersMask);

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(1)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use array of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchOutput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}